

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall
Options::AddSwitch(Options *this,bool *var,char flag,string *long_flag,string *description,
                  bool default_val,string *group)

{
  pointer *ppoVar1;
  pointer pcVar2;
  iterator __position;
  mapped_type *this_00;
  option op;
  string local_b8;
  string local_98;
  string local_78;
  option local_58;
  anon_class_8_1_ba1d8287 local_38;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar2 = (long_flag->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + long_flag->_M_string_length);
  pcVar2 = (description->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + description->_M_string_length);
  pcVar2 = (group->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + group->_M_string_length);
  add_entry<bool&>(this,&local_58,flag,&local_b8,&local_78,&local_98,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_58.has_arg = 2;
  *var = default_val;
  local_38.var = var;
  this_00 = std::
            map<int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
            ::operator[](&this->setters,&local_58.val);
  std::function<void(std::__cxx11::string)>::operator=
            ((function<void(std::__cxx11::string)> *)this_00,&local_38);
  __position._M_current =
       (this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<option,std::allocator<option>>::_M_realloc_insert<option_const&>
              ((vector<option,std::allocator<option>> *)&this->options,__position,&local_58);
  }
  else {
    (__position._M_current)->flag = local_58.flag;
    (__position._M_current)->val = local_58.val;
    *(undefined4 *)&(__position._M_current)->field_0x1c = local_58._28_4_;
    (__position._M_current)->name = local_58.name;
    *(ulong *)&(__position._M_current)->has_arg = CONCAT44(local_58._12_4_,local_58.has_arg);
    ppoVar1 = &(this->options).super__Vector_base<option,_std::allocator<option>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppoVar1 = *ppoVar1 + 1;
  }
  return;
}

Assistant:

inline void Options::AddSwitch(bool& var, char flag, std::string long_flag, std::string description, bool default_val, std::string group) {
    struct option op;
    this->add_entry<bool&>(op, flag, long_flag, description, group);

    op.has_arg = optional_argument;
    var = default_val;

    this->setters[op.val] = [&var](std::string) {
        var = !var;
    };

    this->options.push_back(op);
}